

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O2

void __thiscall
TEST_TestRegistry_listTestGroupNames_shouldListBackwardsGroup1AfterGroup11AndGroup2OnlyOnce_Test::
TEST_TestRegistry_listTestGroupNames_shouldListBackwardsGroup1AfterGroup11AndGroup2OnlyOnce_Test
          (TEST_TestRegistry_listTestGroupNames_shouldListBackwardsGroup1AfterGroup11AndGroup2OnlyOnce_Test
           *this)

{
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test4 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).output = (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry = (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).mockResult = (MockTestResult *)0x0;
  TEST_GROUP_CppUTestGroupTestRegistry::TEST_GROUP_CppUTestGroupTestRegistry
            (&this->super_TEST_GROUP_CppUTestGroupTestRegistry);
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_0037a308;
  return;
}

Assistant:

TEST(TestRegistry, listTestGroupNames_shouldListBackwardsGroup1AfterGroup11AndGroup2OnlyOnce)
{
    test1->setGroupName("GROUP_1");
    myRegistry->addTest(test1);
    test2->setGroupName("GROUP_2");
    myRegistry->addTest(test2);
    test3->setGroupName("GROUP_11");
    myRegistry->addTest(test3);
    test4->setGroupName("GROUP_2");
    myRegistry->addTest(test4);

    myRegistry->listTestGroupNames(*result);
    SimpleString s = output->getOutput();
    STRCMP_EQUAL("GROUP_2 GROUP_11 GROUP_1", s.asCharString());
}